

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBoxPrivate::setVisible(QMessageBoxPrivate *this,bool visible)

{
  byte bVar1;
  QMessageBox *pQVar2;
  ulong uVar3;
  byte in_SIL;
  QMessageBoxPrivate *in_RDI;
  bool in_stack_0000000f;
  QMessageBox *q;
  bool in_stack_00000037;
  QDialogPrivate *in_stack_00000038;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (bVar1 != 0) {
    pQVar2 = q_func(in_RDI);
    if ((in_RDI->autoAddOkButton & 1U) != 0) {
      QMessageBox::addButton
                ((QMessageBox *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                 (StandardButton)((ulong)pQVar2 >> 0x20));
    }
    detectEscapeButton((QMessageBoxPrivate *)q);
  }
  uVar3 = (**(code **)(*(long *)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate + 0xa8))();
  if ((uVar3 & 1) != 0) {
    QDialogPrivate::setNativeDialogVisible((QDialogPrivate *)q,in_stack_0000000f);
  }
  QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
  QDialogPrivate::setVisible(in_stack_00000038,in_stack_00000037);
  return;
}

Assistant:

void QMessageBoxPrivate::setVisible(bool visible)
{
    // Last minute setup
    if (visible) {
        Q_Q(QMessageBox);
        if (autoAddOkButton)
            q->addButton(QMessageBox::Ok);
        detectEscapeButton();
    }
    // On hide, we may be called from ~QDialog(), so prevent accessing
    // q_ptr as a QMessageBox!

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);

    // Update WA_DontShowOnScreen based on whether the native dialog was shown,
    // so that QDialog::setVisible(visible) below updates the QWidget state correctly,
    // but skips showing the non-native version.
    static_cast<QWidget*>(q_ptr)->setAttribute(Qt::WA_DontShowOnScreen, nativeDialogInUse);

    QDialogPrivate::setVisible(visible);
}